

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageDataOperations.h
# Opt level: O3

void fe::operations::
     applyOperationT<fe::operations::op_blit_colored,fe::PixelR8G8B8A8,fe::PixelB8G8R8A8>
               (op_blit_colored *op,PixelR8G8B8A8 *srcPixelFormat,PixelB8G8R8A8 *destPixelFormat,
               ImageData *src,ImageData *dest)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  int iVar4;
  undefined1 auVar5 [16];
  bool bVar6;
  uint8_t *puVar7;
  uint8_t *puVar8;
  int iVar9;
  uint8_t *puVar10;
  uint8_t *puVar11;
  undefined1 auVar12 [16];
  ushort uVar13;
  ushort uVar14;
  ushort uVar17;
  ushort uVar18;
  ushort uVar19;
  ushort uVar20;
  ushort uVar21;
  ushort uVar22;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  bVar6 = check(src,dest);
  auVar5 = _DAT_00116220;
  if ((bVar6) && (iVar1 = (dest->super_fe_image).h, iVar1 != 0)) {
    iVar2 = (dest->super_fe_image).w;
    puVar10 = (dest->super_fe_image).data;
    puVar11 = (src->super_fe_image).data;
    iVar9 = 0;
    iVar4 = iVar2;
    puVar8 = puVar11;
    puVar7 = puVar10;
    do {
      for (; iVar4 != 0; iVar4 = iVar4 + -1) {
        uVar3 = *(undefined4 *)puVar11;
        auVar12._8_8_ = 0;
        auVar12._0_8_ =
             (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((
                                                  uint)uVar3 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)uVar3 >> 0x10),uVar3)) >>
                                                  0x20),uVar3) >> 0x18),
                                             CONCAT12((char)((uint)uVar3 >> 8),(short)uVar3)) >>
                                   0x10),(short)uVar3) & 0xffff00ff00ff00ff;
        uVar3 = *(undefined4 *)(op->color).field_0.field_0.bytes;
        auVar15._8_8_ = 0;
        auVar15._0_8_ =
             (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((
                                                  uint)uVar3 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)uVar3 >> 0x10),uVar3)) >>
                                                  0x20),uVar3) >> 0x18),
                                             CONCAT12((char)((uint)uVar3 >> 8),(short)uVar3)) >>
                                   0x10),(short)uVar3) & 0xffff00ff00ff00ff;
        auVar12 = pshuflw(auVar12,auVar12,0xc6);
        auVar15 = pshuflw(auVar15,auVar15,0xc6);
        auVar16._0_2_ = auVar15._0_2_ * auVar12._0_2_;
        auVar16._2_2_ = auVar15._2_2_ * auVar12._2_2_;
        auVar16._4_2_ = auVar15._4_2_ * auVar12._4_2_;
        auVar16._6_2_ = auVar15._6_2_ * auVar12._6_2_;
        auVar16._8_2_ = auVar15._8_2_ * auVar12._8_2_;
        auVar16._10_2_ = auVar15._10_2_ * auVar12._10_2_;
        auVar16._12_2_ = auVar15._12_2_ * auVar12._12_2_;
        auVar16._14_2_ = auVar15._14_2_ * auVar12._14_2_;
        auVar12 = pmulhuw(auVar16,auVar5);
        uVar13 = auVar12._0_2_ >> 7;
        uVar17 = auVar12._2_2_ >> 7;
        uVar19 = auVar12._4_2_ >> 7;
        uVar21 = auVar12._6_2_ >> 7;
        uVar14 = uVar13 & 0xff;
        uVar18 = uVar17 & 0xff;
        uVar20 = uVar19 & 0xff;
        uVar22 = uVar21 & 0xff;
        *(uint *)puVar10 =
             CONCAT13((uVar22 != 0) * (uVar22 < 0x100) * (char)uVar21 - (0xff < uVar22),
                      CONCAT12((uVar20 != 0) * (uVar20 < 0x100) * (char)uVar19 - (0xff < uVar20),
                               CONCAT11((uVar18 != 0) * (uVar18 < 0x100) * (char)uVar17 -
                                        (0xff < uVar18),
                                        (uVar14 != 0) * (uVar14 < 0x100) * (char)uVar13 -
                                        (0xff < uVar14))));
        puVar10 = puVar10 + (dest->super_fe_image).bytespp;
        puVar11 = puVar11 + (src->super_fe_image).bytespp;
      }
      puVar11 = puVar8 + (src->super_fe_image).pitch;
      puVar10 = puVar7 + (dest->super_fe_image).pitch;
      iVar9 = iVar9 + 1;
      iVar4 = iVar2;
      puVar8 = puVar11;
      puVar7 = puVar10;
    } while (iVar9 != iVar1);
  }
  return;
}

Assistant:

void applyOperationT(const Op& op, const Src& srcPixelFormat, Dest& destPixelFormat, const ImageData& src, const ImageData& dest)
        {
            if (!check(src, dest))
                return;

            const unsigned char* srcBuffer = (unsigned char*)src.data;
            unsigned char* destBuffer = (unsigned char*)dest.data;

            int w = dest.w;
            int h = dest.h;

            for (int y = 0; y != h; ++y)
            {
                const unsigned char* srcLine = srcBuffer;
                unsigned char* destLine = destBuffer;

                for (int x = 0; x != w; ++x)
                {
                    op(srcPixelFormat, destPixelFormat, srcLine, destLine, x, y);

                    destLine += dest.bytespp;
                    srcLine += src.bytespp;
                }

                srcBuffer += src.pitch;
                destBuffer += dest.pitch;
            }
        }